

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

bool __thiscall cmGlobalGenerator::CheckTargetsForMissingSources(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  cmGeneratorTarget *this_00;
  cmake *this_01;
  pointer pbVar2;
  bool bVar3;
  TargetType TVar4;
  char *val;
  string *psVar5;
  string *config;
  pointer config_00;
  pointer ppcVar6;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> srcs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  ostringstream e;
  bool local_24c;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_248;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228;
  cmGlobalGenerator *local_210;
  pointer local_208;
  pointer local_200;
  string local_1f8;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_200 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_208 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_200 == local_208) {
    local_24c = false;
  }
  else {
    local_24c = false;
    local_210 = this;
    do {
      ppcVar1 = ((*local_200)->GeneratorTargets).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar6 = ((*local_200)->GeneratorTargets).
                     super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                     _M_impl.super__Vector_impl_data._M_start; ppcVar6 != ppcVar1;
          ppcVar6 = ppcVar6 + 1) {
        this_00 = *ppcVar6;
        TVar4 = cmGeneratorTarget::GetType(this_00);
        if (((TVar4 != GLOBAL_TARGET) &&
            (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 != INTERFACE_LIBRARY)) &&
           (TVar4 = cmGeneratorTarget::GetType(this_00), TVar4 != UTILITY)) {
          local_1a8._M_allocated_capacity = (size_type)local_198;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_1a8,"ghs_integrity_app","");
          val = cmGeneratorTarget::GetProperty(this_00,(string *)&local_1a8);
          bVar3 = cmSystemTools::IsOn(val);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_allocated_capacity != local_198) {
            operator_delete((void *)local_1a8._M_allocated_capacity,
                            local_198[0]._M_allocated_capacity + 1);
          }
          if (!bVar3) {
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
            local_228.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmMakefile::GetConfigurations
                      ((string *)(local_1d8 + 0x10),this_00->Makefile,&local_228,true);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d8._16_8_ != &local_1b8) {
              operator_delete((void *)local_1d8._16_8_,local_1b8._M_allocated_capacity + 1);
            }
            pbVar2 = local_228.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            config_00 = local_228.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            if (local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                local_228.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              local_1a8._M_allocated_capacity = (size_type)local_198;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"");
              cmGeneratorTarget::GetSourceFiles(this_00,&local_248,(string *)&local_1a8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1a8._M_allocated_capacity != local_198) {
                operator_delete((void *)local_1a8._M_allocated_capacity,
                                local_198[0]._M_allocated_capacity + 1);
              }
            }
            else {
              do {
                cmGeneratorTarget::GetSourceFiles(this_00,&local_248,config_00);
                if (local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_start ==
                    local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish) break;
                config_00 = config_00 + 1;
              } while (config_00 != pbVar2);
            }
            if (local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start ==
                local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8._M_local_buf);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,"No SOURCES given to target: ",0x1c);
              psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(this_00);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_1a8,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
              this_01 = local_210->CMakeInstance;
              std::__cxx11::stringbuf::str();
              cmGeneratorTarget::GetBacktrace((cmGeneratorTarget *)local_1d8);
              cmake::IssueMessage(this_01,FATAL_ERROR,&local_1f8,(cmListFileBacktrace *)local_1d8);
              if ((cmMakefile *)local_1d8._8_8_ != (cmMakefile *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d8._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                operator_delete(local_1f8._M_dataplus._M_p,
                                local_1f8.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8._M_local_buf);
              std::ios_base::~ios_base(local_138);
              local_24c = true;
            }
            if (local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_248.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)local_248.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_248.
                                    super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&local_228);
          }
        }
      }
      local_200 = local_200 + 1;
    } while (local_200 != local_208);
  }
  return local_24c;
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}